

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DiskLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,DiskLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Rb_tree_node_base *__k;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  undefined7 extraout_var;
  ostream *poVar7;
  long *plVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  Property *args;
  char *pcVar12;
  char *pcVar13;
  string *args_1;
  Attribute *attr;
  Property *prop;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined1 local_320 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_308;
  string local_2f8;
  string *local_2d8;
  string *local_2d0;
  long *local_2c8 [2];
  long local_2b8 [2];
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_2a8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_2a0;
  undefined8 local_298;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_260;
  Property *local_258;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_250;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_248;
  _Rb_tree_node_base *local_240;
  undefined1 local_238 [16];
  code *local_228;
  code *pcStack_220;
  ios_base local_1c8 [272];
  string local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_298 = 0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d8 = warn;
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_290,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar5) {
    p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_240 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_298 = CONCAT71(extraout_var,p_Var11 == local_240);
    if (p_Var11 != local_240) {
      local_248 = &light->radius;
      local_250 = &(light->super_BoundableLight).extent;
      local_260 = &(light->super_BoundableLight).props;
      local_2a8 = &(light->super_BoundableLight).purpose;
      local_2a0 = &(light->super_BoundableLight).visibility;
      local_2d0 = err;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(p_Var11 + 1),
                   (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
        prop = (Property *)(p_Var11 + 2);
        local_238._0_8_ = &local_228;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"inputs:radius","");
        args_1 = (string *)local_238;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_320,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_290,&local_98,prop,(string *)local_238,local_248);
        if ((code **)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
        if ((local_320._0_8_ & 0xfffffffd) == 0) {
          iVar6 = 3;
LAB_00208712:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_320._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_238,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((string *)local_238,0xcd9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            local_2c8[0] = local_2b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2c8,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[14],std::__cxx11::string>
                      (&local_2f8,(fmt *)local_2c8,(string *)"inputs:radius",
                       (char (*) [14])(local_320 + 8),args_1);
            poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_238,local_2f8._M_dataplus._M_p,
                                local_2f8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            paVar3 = &local_2f8.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != paVar3) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2c8[0] != local_2b8) {
              operator_delete(local_2c8[0],local_2b8[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar8 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_2c8,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8.field_2._8_8_ = plVar8[3];
                local_2f8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_2f8.field_2._M_allocated_capacity = *psVar1;
                local_2f8._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_2f8._M_string_length = plVar8[1];
              *plVar8 = (long)psVar1;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if (local_2c8[0] != local_2b8) {
                operator_delete(local_2c8[0],local_2b8[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
            ::std::ios_base::~ios_base(local_1c8);
            iVar6 = 1;
            goto LAB_00208712;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._8_8_ != &aStack_308) {
          operator_delete((void *)local_320._8_8_,aStack_308._M_allocated_capacity + 1);
        }
        if (bVar5) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          local_238._0_8_ = &local_228;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"extent","");
          args = prop;
          anon_unknown_0::ParseExtentAttribute
                    ((ParseResult *)local_320,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_290,&local_b8,prop,(string *)local_238,local_250);
          if ((code **)local_238._0_8_ != &local_228) {
            operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          iVar6 = 0;
          if ((local_320._0_8_ & 0xfffffffd) == 0) {
            iVar6 = 3;
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (local_320._0_4_ != Unmatched) {
              local_258 = prop;
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_238,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<((string *)local_238,0xcda);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              local_2c8[0] = local_2b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2c8,"Parsing attribute `extent` failed. Error: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)&local_2f8,(fmt *)local_2c8,(string *)(local_320 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_238,local_2f8._M_dataplus._M_p,
                                  local_2f8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              paVar3 = &local_2f8.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f8._M_dataplus._M_p != paVar3) {
                operator_delete(local_2f8._M_dataplus._M_p,
                                local_2f8.field_2._M_allocated_capacity + 1);
              }
              if (local_2c8[0] != local_2b8) {
                operator_delete(local_2c8[0],local_2b8[0] + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar8 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_2c8,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_2f8.field_2._M_allocated_capacity = *psVar1;
                  local_2f8.field_2._8_8_ = plVar8[3];
                  local_2f8._M_dataplus._M_p = (pointer)paVar3;
                }
                else {
                  local_2f8.field_2._M_allocated_capacity = *psVar1;
                  local_2f8._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_2f8._M_string_length = plVar8[1];
                *plVar8 = (long)psVar1;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_2f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f8._M_dataplus._M_p != paVar3) {
                  operator_delete(local_2f8._M_dataplus._M_p,
                                  local_2f8.field_2._M_allocated_capacity + 1);
                }
                if (local_2c8[0] != local_2b8) {
                  operator_delete(local_2c8[0],local_2b8[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
              ::std::ios_base::~ios_base(local_1c8);
              iVar6 = 1;
              bVar5 = false;
              prop = local_258;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._8_8_ != &aStack_308) {
            operator_delete((void *)local_320._8_8_,aStack_308._M_allocated_capacity + 1);
          }
          if (bVar5) {
            __k = p_Var11 + 1;
            iVar6 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar6 == 0) {
              local_238._0_8_ = &local_228;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"visibility","")
              ;
              cVar9 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_290,(string *)local_238);
              if ((code **)local_238._0_8_ != &local_228) {
                operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
              }
              err = local_2d0;
              iVar6 = 3;
              if ((_Rb_tree_header *)cVar9._M_node == &local_290._M_impl.super__Rb_tree_header) {
                if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  local_238._0_8_ = &local_228;
                  local_238._8_8_ = 0;
                  local_228 = (code *)((ulong)local_228 & 0xffffffffffffff00);
                }
                else {
                  Attribute::type_name_abi_cxx11_((string *)local_238,&prop->_attrib);
                }
                local_320._0_8_ = local_320 + 0x10;
                local_320._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_320._16_6_ = 0x6e656b6f74;
                if (((local_238._8_8_ == 5) &&
                    (iVar6 = bcmp((void *)local_238._0_8_,local_320 + 0x10,5), iVar6 == 0)) &&
                   (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                  if ((code **)local_238._0_8_ != &local_228) {
                    operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
                  }
                  if (uVar4 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,"():",3);
                    poVar7 = (ostream *)::std::ostream::operator<<((string *)local_238,0xcdc);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_238,"\n",1);
                    if (local_2d8 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar8 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)&local_2f8,(ulong)(err->_M_dataplus)._M_p)
                      ;
                      psVar1 = (size_type *)(plVar8 + 2);
                      if ((size_type *)*plVar8 == psVar1) {
                        local_320._16_8_ = *psVar1;
                        aStack_308._M_allocated_capacity = plVar8[3];
                        local_320._0_8_ = local_320 + 0x10;
                      }
                      else {
                        local_320._16_8_ = *psVar1;
                        local_320._0_8_ = (size_type *)*plVar8;
                      }
                      local_320._8_8_ = plVar8[1];
                      *plVar8 = (long)psVar1;
                      plVar8[1] = 0;
                      *(undefined1 *)(plVar8 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_2d8,(string *)local_320);
                      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                        operator_delete(local_2f8._M_dataplus._M_p,
                                        local_2f8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
                    ::std::ios_base::~ios_base(local_1c8);
                    AttrMetas::operator=(&local_2a0->_metas,(AttrMetas *)(p_Var11 + 7));
                    pcVar13 = "visibility";
                    pcVar12 = "";
LAB_0020975d:
                    iVar6 = 3;
                    local_238._0_8_ = &local_228;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_238,pcVar13,pcVar12);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_290,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_238);
                    if ((code **)local_238._0_8_ != &local_228) {
                      operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
                    }
                    goto LAB_0020966c;
                  }
                }
                else if ((code **)local_238._0_8_ != &local_228) {
                  operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
                }
                local_238._8_8_ = 0;
                local_238._0_8_ = VisibilityEnumHandler;
                pcStack_220 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_228 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_320._0_8_ = local_320 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_320,"visibility","");
                bVar5 = options->strict_allowedToken_check;
                local_48 = (code *)0x0;
                pcStack_40 = (code *)0x0;
                local_58._M_unused._M_object = (void *)0x0;
                local_58._8_8_ = 0;
                if (local_228 != (code *)0x0) {
                  (*local_228)(&local_58,(string *)local_238,2);
                  local_48 = local_228;
                  pcStack_40 = pcStack_220;
                }
                bVar5 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                  ((string *)local_320,bVar5,
                                   (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,&prop->_attrib,
                                   local_2a0,local_2d8,err);
                if (local_48 != (code *)0x0) {
                  (*local_48)(&local_58,&local_58,__destroy_functor);
                }
                if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                  operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                }
                iVar6 = 1;
                if (bVar5) {
                  AttrMetas::operator=(&local_2a0->_metas,(AttrMetas *)(p_Var11 + 7));
                  pcVar13 = "visibility";
                  pcVar12 = "";
LAB_0020958b:
                  local_320._0_8_ = local_320 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_320,pcVar13,pcVar12);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_290,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_320);
                  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                  }
                  iVar6 = 3;
                }
LAB_002095bd:
                if (local_228 != (code *)0x0) {
                  (*local_228)(local_238,local_238,3);
                }
              }
            }
            else {
              iVar6 = ::std::__cxx11::string::compare((char *)__k);
              if (iVar6 == 0) {
                local_238._0_8_ = &local_228;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"purpose","");
                cVar9 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&local_290,(string *)local_238);
                if ((code **)local_238._0_8_ != &local_228) {
                  operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
                }
                err = local_2d0;
                iVar6 = 3;
                if ((_Rb_tree_header *)cVar9._M_node == &local_290._M_impl.super__Rb_tree_header) {
                  if (((ulong)p_Var11[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                    local_238._0_8_ = &local_228;
                    local_238._8_8_ = 0;
                    local_228 = (code *)((ulong)local_228 & 0xffffffffffffff00);
                  }
                  else {
                    Attribute::type_name_abi_cxx11_((string *)local_238,&prop->_attrib);
                  }
                  local_320._0_8_ = local_320 + 0x10;
                  local_320._8_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x5;
                  local_320._16_6_ = 0x6e656b6f74;
                  if (((local_238._8_8_ == 5) &&
                      (iVar6 = bcmp((void *)local_238._0_8_,local_320 + 0x10,5), iVar6 == 0)) &&
                     (uVar4 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar4 < 2)) {
                    if ((code **)local_238._0_8_ != &local_228) {
                      operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
                    }
                    if (uVar4 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,"():",3);
                      poVar7 = (ostream *)::std::ostream::operator<<((string *)local_238,0xcde);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,"purpose",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_238,"\n",1);
                      if (local_2d8 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_320,&local_2f8,err);
                        ::std::__cxx11::string::operator=((string *)local_2d8,(string *)local_320);
                        if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                          operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                          operator_delete(local_2f8._M_dataplus._M_p,
                                          local_2f8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
                      ::std::ios_base::~ios_base(local_1c8);
                      AttrMetas::operator=(&local_2a8->_metas,(AttrMetas *)(p_Var11 + 7));
                      pcVar13 = "purpose";
                      pcVar12 = "";
                      goto LAB_0020975d;
                    }
                  }
                  else if ((code **)local_238._0_8_ != &local_228) {
                    operator_delete((void *)local_238._0_8_,(ulong)((long)local_228 + 1));
                  }
                  local_238._8_8_ = 0;
                  local_238._0_8_ = PurposeEnumHandler;
                  pcStack_220 = ::std::
                                _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                ::_M_invoke;
                  local_228 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_manager;
                  local_320._0_8_ = local_320 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_320,"purpose","");
                  bVar5 = options->strict_allowedToken_check;
                  local_68 = (code *)0x0;
                  pcStack_60 = (code *)0x0;
                  local_78._M_unused._M_object = (void *)0x0;
                  local_78._8_8_ = 0;
                  if (local_228 != (code *)0x0) {
                    (*local_228)(&local_78,(string *)local_238,2);
                    local_68 = local_228;
                    pcStack_60 = pcStack_220;
                  }
                  bVar5 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                    ((string *)local_320,bVar5,
                                     (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,&prop->_attrib,
                                     local_2a8,local_2d8,err);
                  if (local_68 != (code *)0x0) {
                    (*local_68)(&local_78,&local_78,__destroy_functor);
                  }
                  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
                    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                  }
                  iVar6 = 1;
                  if (bVar5) {
                    AttrMetas::operator=(&local_2a8->_metas,(AttrMetas *)(p_Var11 + 7));
                    pcVar13 = "purpose";
                    pcVar12 = "";
                    goto LAB_0020958b;
                  }
                  goto LAB_002095bd;
                }
              }
              else {
                cVar9 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&local_290,(key_type *)__k);
                if ((_Rb_tree_header *)cVar9._M_node == &local_290._M_impl.super__Rb_tree_header) {
                  pmVar10 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                            ::operator[](local_260,(key_type *)__k);
                  ::std::__cxx11::string::_M_assign((string *)pmVar10);
                  (pmVar10->_attrib)._varying_authored = (bool)p_Var11[3].field_0x4;
                  (pmVar10->_attrib)._variability = p_Var11[3]._M_color;
                  ::std::__cxx11::string::_M_assign((string *)&(pmVar10->_attrib)._type_name);
                  linb::any::operator=((any *)&(pmVar10->_attrib)._var,(any *)&p_Var11[4]._M_parent)
                  ;
                  (pmVar10->_attrib)._var._blocked = SUB41(p_Var11[5]._M_color,0);
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&(pmVar10->_attrib)._var._ts,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&p_Var11[5]._M_parent);
                  (pmVar10->_attrib)._var._ts._dirty = SUB41(p_Var11[6]._M_color,0);
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            (&(pmVar10->_attrib)._paths,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var11[6]._M_parent);
                  AttrMetas::operator=(&(pmVar10->_attrib)._metas,(AttrMetas *)(p_Var11 + 7));
                  *(_Base_ptr *)&pmVar10->_listOpQual = p_Var11[0x17]._M_parent;
                  (pmVar10->_rel).type = *(Type *)&p_Var11[0x17]._M_left;
                  Path::operator=(&(pmVar10->_rel).targetPath,(Path *)&p_Var11[0x17]._M_right);
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            (&(pmVar10->_rel).targetPathVector,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var11[0x1e]._M_parent);
                  (pmVar10->_rel).listOpQual = p_Var11[0x1f]._M_color;
                  AttrMetas::operator=
                            (&(pmVar10->_rel)._metas,(AttrMetas *)&p_Var11[0x1f]._M_parent);
                  (pmVar10->_rel)._varying_authored = *(bool *)&p_Var11[0x2f]._M_left;
                  ::std::__cxx11::string::_M_assign((string *)&pmVar10->_prop_value_type_name);
                  pmVar10->_has_custom = *(bool *)&p_Var11[0x30]._M_right;
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_290,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
                }
                cVar9 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find(&local_290,(key_type *)__k);
                iVar6 = 0;
                err = local_2d0;
                if ((_Rb_tree_header *)cVar9._M_node == &local_290._M_impl.super__Rb_tree_header) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_238,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_238,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_238,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"():",3)
                  ;
                  poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_238,0xce0);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_320,"Unsupported/unimplemented property: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__k);
                  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_238,(char *)local_320._0_8_,local_320._8_8_);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  psVar1 = (size_type *)(local_320 + 0x10);
                  if ((size_type *)local_320._0_8_ != psVar1) {
                    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                  }
                  err = local_2d0;
                  if (local_2d8 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar8 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)&local_2f8,(ulong)(err->_M_dataplus)._M_p);
                    psVar2 = (size_type *)(plVar8 + 2);
                    if ((size_type *)*plVar8 == psVar2) {
                      local_320._16_8_ = *psVar2;
                      aStack_308._M_allocated_capacity = plVar8[3];
                      local_320._0_8_ = psVar1;
                    }
                    else {
                      local_320._16_8_ = *psVar2;
                      local_320._0_8_ = (size_type *)*plVar8;
                    }
                    local_320._8_8_ = plVar8[1];
                    *plVar8 = (long)psVar2;
                    plVar8[1] = 0;
                    *(undefined1 *)(plVar8 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)local_2d8,(string *)local_320);
                    if ((size_type *)local_320._0_8_ != psVar1) {
                      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                      operator_delete(local_2f8._M_dataplus._M_p,
                                      local_2f8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
                  ::std::ios_base::~ios_base(local_1c8);
                }
              }
            }
          }
        }
LAB_0020966c:
        if ((iVar6 != 3) && (iVar6 != 0)) break;
        p_Var11 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var11);
        local_298 = CONCAT71((int7)((ulong)p_Var11 >> 8),p_Var11 == local_240);
      } while (p_Var11 != local_240);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_290,(_Link_type)local_290._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)((byte)local_298 & 1);
}

Assistant:

bool ReconstructPrim<DiskLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DiskLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:radius", DiskLight, light->radius)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, DiskLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DiskLight,
                       light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DiskLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, DiskLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}